

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BitSetImplement.h
# Opt level: O3

void * __thiscall
BitSetImplement<std::bitset<16000UL>,_KDefectiveMADEC>::setIntersection
          (BitSetImplement<std::bitset<16000UL>,_KDefectiveMADEC> *this,void *A,void *B)

{
  uint *puVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  void *__dest;
  long lVar8;
  bitset<16000UL> __result;
  uint local_7e8 [500];
  
  __dest = operator_new(2000);
  memcpy(local_7e8,A,2000);
  lVar8 = 0;
  do {
    puVar1 = (uint *)((long)B + lVar8 * 8);
    uVar2 = puVar1[1];
    uVar3 = puVar1[2];
    uVar4 = puVar1[3];
    uVar5 = local_7e8[lVar8 * 2 + 1];
    uVar6 = local_7e8[lVar8 * 2 + 2];
    uVar7 = local_7e8[lVar8 * 2 + 3];
    local_7e8[lVar8 * 2] = local_7e8[lVar8 * 2] & *puVar1;
    local_7e8[lVar8 * 2 + 1] = uVar5 & uVar2;
    local_7e8[lVar8 * 2 + 2] = uVar6 & uVar3;
    local_7e8[lVar8 * 2 + 3] = uVar7 & uVar4;
    lVar8 = lVar8 + 2;
  } while (lVar8 != 0xfa);
  memcpy(__dest,local_7e8,2000);
  return __dest;
}

Assistant:

void* BitSetImplement<Bitset, Base>::setIntersection(void *A, void *B) {
	Bitset *__A__ = (Bitset*) A, *__B__ = (Bitset*) B, *__C__ = new Bitset();
	*__C__ = (*__A__) & (*__B__);
	return __C__;
}